

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroup.hpp
# Opt level: O2

void __thiscall OpenMD::CutoffGroup::addAtom(CutoffGroup *this,Atom *atom)

{
  Atom *local_8;
  
  local_8 = atom;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::push_back
            (&this->cutoffAtomList,&local_8);
  return;
}

Assistant:

void addAtom(Atom* atom) { cutoffAtomList.push_back(atom); }